

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator::GenerateInterfaceMembers
          (RepeatedImmutableMessageFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  Options OStack_1b8;
  Options local_168;
  Options local_118;
  Options local_c8;
  Options local_78;
  
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  Options::Options(&local_78,&((this->super_ImmutableMessageFieldGenerator).context_)->options_);
  WriteFieldDocComment(printer,pFVar1,&local_78,false);
  Options::~Options(&local_78);
  vars = &(this->super_ImmutableMessageFieldGenerator).variables_;
  text._M_str = "$deprecation$java.util.List<$type$> \n    get$capitalized_name$List();\n";
  text._M_len = 0x46;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  Options::Options(&local_c8,&((this->super_ImmutableMessageFieldGenerator).context_)->options_);
  WriteFieldDocComment(printer,pFVar1,&local_c8,false);
  Options::~Options(&local_c8);
  text_00._M_str = "$deprecation$$type$ get$capitalized_name$(int index);\n";
  text_00._M_len = 0x36;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  Options::Options(&local_118,&((this->super_ImmutableMessageFieldGenerator).context_)->options_);
  WriteFieldDocComment(printer,pFVar1,&local_118,false);
  Options::~Options(&local_118);
  text_01._M_str = "$deprecation$int get$capitalized_name$Count();\n";
  text_01._M_len = 0x2f;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_01);
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  Options::Options(&local_168,&((this->super_ImmutableMessageFieldGenerator).context_)->options_);
  WriteFieldDocComment(printer,pFVar1,&local_168,false);
  Options::~Options(&local_168);
  text_02._M_str =
       "$deprecation$java.util.List<? extends $type$OrBuilder> \n    get$capitalized_name$OrBuilderList();\n"
  ;
  text_02._M_len = 0x62;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_02);
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  Options::Options(&OStack_1b8,&((this->super_ImmutableMessageFieldGenerator).context_)->options_);
  WriteFieldDocComment(printer,pFVar1,&OStack_1b8,false);
  Options::~Options(&OStack_1b8);
  text_03._M_str = "$deprecation$$type$OrBuilder get$capitalized_name$OrBuilder(\n    int index);\n"
  ;
  text_03._M_len = 0x4d;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_03);
  return;
}

Assistant:

void RepeatedImmutableMessageFieldGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  // TODO: In the future, consider having methods specific to the
  // interface so that builders can choose dynamically to either return a
  // message or a nested builder, so that asking for the interface doesn't
  // cause a message to ever be built.
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$java.util.List<$type$> \n"
                 "    get$capitalized_name$List();\n");
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$$type$ get$capitalized_name$(int index);\n");
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$int get$capitalized_name$Count();\n");

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$java.util.List<? extends $type$OrBuilder> \n"
                 "    get$capitalized_name$OrBuilderList();\n");
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "$deprecation$$type$OrBuilder get$capitalized_name$OrBuilder(\n"
      "    int index);\n");
}